

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createSpecConstantOp
          (Builder *this,Op opCode,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literals)

{
  bool bVar1;
  Id IVar2;
  Instruction *this_00;
  size_type __n;
  uint *puVar3;
  Id *pIVar4;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id local_34;
  
  this_00 = (Instruction *)operator_new(0x60);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  this_00->resultId = IVar2;
  this_00->typeId = typeId;
  this_00->opCode = OpSpecConstantOp;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  __n = ((long)(operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) +
        ((long)(literals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(literals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) + 1;
  local_34 = typeId;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,__n);
  std::vector<bool,_std::allocator<bool>_>::reserve(&this_00->idOperand,__n);
  Instruction::addImmediateOperand(this_00,opCode);
  for (pIVar4 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pIVar4 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; pIVar4 = pIVar4 + 1) {
    Instruction::addIdOperand(this_00,*pIVar4);
  }
  for (puVar3 = (literals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 != (literals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    Instruction::addImmediateOperand(this_00,*puVar3);
  }
  Module::mapInstruction(&this->module,this_00);
  local_40._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  IVar2 = local_34;
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  bVar1 = containsType(this,IVar2,OpTypeInt,8);
  if (bVar1) {
    local_40._M_head_impl._0_4_ = 0x27;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_40);
  }
  bVar1 = containsType(this,IVar2,OpTypeInt,0x10);
  if (bVar1) {
    local_40._M_head_impl._0_4_ = 0x16;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_40);
  }
  bVar1 = containsType(this,IVar2,OpTypeFloat,0x10);
  if (bVar1) {
    local_40._M_head_impl._0_4_ = 9;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_40);
  }
  return this_00->resultId;
}

Assistant:

Id Builder::createSpecConstantOp(Op opCode, Id typeId, const std::vector<Id>& operands,
    const std::vector<unsigned>& literals)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, OpSpecConstantOp);
    op->reserveOperands(operands.size() + literals.size() + 1);
    op->addImmediateOperand((unsigned) opCode);
    for (auto it = operands.cbegin(); it != operands.cend(); ++it)
        op->addIdOperand(*it);
    for (auto it = literals.cbegin(); it != literals.cend(); ++it)
        op->addImmediateOperand(*it);
    module.mapInstruction(op);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(op));

    // OpSpecConstantOp's using 8 or 16 bit types require the associated capability
    if (containsType(typeId, OpTypeInt, 8))
        addCapability(CapabilityInt8);
    if (containsType(typeId, OpTypeInt, 16))
        addCapability(CapabilityInt16);
    if (containsType(typeId, OpTypeFloat, 16))
        addCapability(CapabilityFloat16);

    return op->getResultId();
}